

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_builder.h
# Opt level: O2

Instruction * __thiscall
spvtools::opt::InstructionBuilder::AddNaryExtendedInstruction
          (InstructionBuilder *this,uint32_t result_type,uint32_t set,uint32_t instruction,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *ext_operands)

{
  uint32_t *puVar1;
  InstructionBuilder *this_00;
  uint32_t res_id;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> this_01;
  Instruction *pIVar2;
  uint32_t *puVar3;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<unsigned_int> init_list_01;
  uint32_t local_c4;
  uint32_t local_c0;
  uint32_t local_bc;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_b8;
  InstructionBuilder *local_b0;
  Operand local_a8;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> operands;
  SmallVector<unsigned_int,_2UL> local_58;
  
  operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  init_list._M_len = 1;
  init_list._M_array = &local_c4;
  local_c4 = set;
  local_c0 = result_type;
  local_bc = instruction;
  local_b8 = ext_operands;
  local_b0 = this;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list);
  local_a8.type = SPV_OPERAND_TYPE_ID;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_a8.words,&local_58);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
  emplace_back<spvtools::opt::Operand>(&operands,&local_a8);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_a8.words);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
  local_c4 = local_bc;
  init_list_00._M_len = 1;
  init_list_00._M_array = &local_c4;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list_00);
  local_a8.type = 7;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_a8.words,&local_58);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
  emplace_back<spvtools::opt::Operand>(&operands,&local_a8);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_a8.words);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
  puVar1 = (local_b8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar3 = (local_b8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start; this_00 = local_b0, puVar3 != puVar1;
      puVar3 = puVar3 + 1) {
    local_c4 = *puVar3;
    init_list_01._M_len = 1;
    init_list_01._M_array = &local_c4;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list_01);
    local_a8.type = 1;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_a8.words,&local_58);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
    emplace_back<spvtools::opt::Operand>(&operands,&local_a8);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_a8.words);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
  }
  res_id = IRContext::TakeNextId(local_b0->context_);
  if (res_id == 0) {
    pIVar2 = (Instruction *)0x0;
  }
  else {
    this_01._M_head_impl = (Instruction *)::operator_new(0x70);
    Instruction::Instruction
              (this_01._M_head_impl,this_00->context_,OpExtInst,local_c0,res_id,&operands);
    local_a8._0_8_ = this_01._M_head_impl;
    pIVar2 = AddInstruction(this_00,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                     *)&local_a8);
    if ((Instruction *)local_a8._0_8_ != (Instruction *)0x0) {
      (**(code **)(*(long *)local_a8._0_8_ + 8))();
    }
  }
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&operands);
  return pIVar2;
}

Assistant:

Instruction* AddNaryExtendedInstruction(
      uint32_t result_type, uint32_t set, uint32_t instruction,
      const std::vector<uint32_t>& ext_operands) {
    std::vector<Operand> operands;
    operands.push_back({SPV_OPERAND_TYPE_ID, {set}});
    operands.push_back(
        {SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER, {instruction}});
    for (uint32_t id : ext_operands) {
      operands.push_back({SPV_OPERAND_TYPE_ID, {id}});
    }

    uint32_t result_id = GetContext()->TakeNextId();
    if (result_id == 0) {
      return nullptr;
    }

    std::unique_ptr<Instruction> new_inst(new Instruction(
        GetContext(), spv::Op::OpExtInst, result_type, result_id, operands));
    return AddInstruction(std::move(new_inst));
  }